

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

string * SimpleLogger::replaceString
                   (string *__return_storage_ptr__,string *src_str,string *before,string *after)

{
  long lVar1;
  ulong uVar2;
  string local_50 [32];
  
  uVar2 = 0;
  lVar1 = std::__cxx11::string::find((string *)src_str,(ulong)before);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)src_str);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    uVar2 = lVar1 + before->_M_string_length;
    lVar1 = std::__cxx11::string::find((string *)src_str,(ulong)before);
  }
  if (uVar2 < src_str->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)src_str);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleLogger::replaceString( const std::string& src_str,
                                         const std::string& before,
                                         const std::string& after )
{
    size_t last = 0;
    size_t pos = src_str.find(before, last);
    std::string ret;
    while (pos != std::string::npos) {
        ret += src_str.substr(last, pos - last);
        ret += after;
        last = pos + before.size();
        pos = src_str.find(before, last);
    }
    if (last < src_str.size()) {
        ret += src_str.substr(last);
    }
    return ret;
}